

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O3

bool IsStandardTx(CTransaction *tx,optional<unsigned_int> *max_datacarrier_bytes,
                 bool permit_bare_multisig,CFeeRate *dust_relay_fee,string *reason)

{
  pointer pCVar1;
  pointer pCVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  CAmount CVar7;
  char *__s;
  size_type __len1;
  size_type __len2;
  CScript *this;
  pointer pCVar8;
  pointer txout;
  uint uVar9;
  long in_FS_OFFSET;
  TxoutType whichType;
  SizeComputer local_50;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (tx->version - 4 < 0xfffffffd) {
    __len1 = reason->_M_string_length;
    __s = "version";
    __len2 = 7;
  }
  else {
    local_50.nSize = 0;
    local_48.m_params = &TX_NO_WITNESS;
    local_48.m_substream = &local_50;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              (tx,&local_48,&TX_NO_WITNESS);
    iVar4 = (int)local_50.nSize * 3;
    local_50.nSize = 0;
    local_48.m_params = &TX_WITH_WITNESS;
    local_48.m_substream = &local_50;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              (tx,&local_48,&TX_WITH_WITNESS);
    if ((uint)(iVar4 + (int)local_50.nSize) < 0x61a81) {
      pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar8 != pCVar1) {
        this = &pCVar8->scriptSig;
        do {
          if (0x68f < (this->super_CScriptBase)._size) {
            __len1 = reason->_M_string_length;
            __s = "scriptsig-size";
            __len2 = 0xe;
            goto LAB_00358106;
          }
          bVar5 = CScript::IsPushOnly(this);
          if (!bVar5) {
            __len1 = reason->_M_string_length;
            __s = "scriptsig-not-pushonly";
            __len2 = 0x16;
            goto LAB_00358106;
          }
          pCVar8 = (pointer)(this + 2);
          this = (CScript *)((long)(this + 3) + 8);
        } while (pCVar8 != pCVar1);
      }
      txout = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start;
      pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar5 = true;
      if (txout == pCVar2) goto LAB_0035810d;
      uVar9 = 0;
      do {
        bVar6 = IsStandard(&txout->scriptPubKey,max_datacarrier_bytes,(TxoutType *)&local_48);
        if (!bVar6) {
          __len1 = reason->_M_string_length;
          __s = "scriptpubkey";
          __len2 = 0xc;
          goto LAB_00358106;
        }
        if ((int)local_48.m_params == 5) {
          if (!permit_bare_multisig) {
            __len1 = reason->_M_string_length;
            __s = "bare-multisig";
            __len2 = 0xd;
            goto LAB_00358106;
          }
LAB_003581bb:
          lVar3 = txout->nValue;
          CVar7 = GetDustThreshold(txout,dust_relay_fee);
          if (lVar3 < CVar7) {
            __len1 = reason->_M_string_length;
            __s = "dust";
            __len2 = 4;
            goto LAB_00358106;
          }
        }
        else {
          if ((int)local_48.m_params != 6) goto LAB_003581bb;
          uVar9 = uVar9 + 1;
        }
        txout = txout + 1;
      } while (txout != pCVar2);
      if (uVar9 < 2) goto LAB_0035810d;
      __len1 = reason->_M_string_length;
      __s = "multi-op-return";
      __len2 = 0xf;
    }
    else {
      __len1 = reason->_M_string_length;
      __s = "tx-size";
      __len2 = 7;
    }
  }
LAB_00358106:
  bVar5 = false;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (reason,0,__len1,__s,__len2);
LAB_0035810d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool IsStandardTx(const CTransaction& tx, const std::optional<unsigned>& max_datacarrier_bytes, bool permit_bare_multisig, const CFeeRate& dust_relay_fee, std::string& reason)
{
    if (tx.version > TX_MAX_STANDARD_VERSION || tx.version < 1) {
        reason = "version";
        return false;
    }

    // Extremely large transactions with lots of inputs can cost the network
    // almost as much to process as they cost the sender in fees, because
    // computing signature hashes is O(ninputs*txsize). Limiting transactions
    // to MAX_STANDARD_TX_WEIGHT mitigates CPU exhaustion attacks.
    unsigned int sz = GetTransactionWeight(tx);
    if (sz > MAX_STANDARD_TX_WEIGHT) {
        reason = "tx-size";
        return false;
    }

    for (const CTxIn& txin : tx.vin)
    {
        // Biggest 'standard' txin involving only keys is a 15-of-15 P2SH
        // multisig with compressed keys (remember the MAX_SCRIPT_ELEMENT_SIZE byte limit on
        // redeemScript size). That works out to a (15*(33+1))+3=513 byte
        // redeemScript, 513+1+15*(73+1)+3=1627 bytes of scriptSig, which
        // we round off to 1650(MAX_STANDARD_SCRIPTSIG_SIZE) bytes for
        // some minor future-proofing. That's also enough to spend a
        // 20-of-20 CHECKMULTISIG scriptPubKey, though such a scriptPubKey
        // is not considered standard.
        if (txin.scriptSig.size() > MAX_STANDARD_SCRIPTSIG_SIZE) {
            reason = "scriptsig-size";
            return false;
        }
        if (!txin.scriptSig.IsPushOnly()) {
            reason = "scriptsig-not-pushonly";
            return false;
        }
    }

    unsigned int nDataOut = 0;
    TxoutType whichType;
    for (const CTxOut& txout : tx.vout) {
        if (!::IsStandard(txout.scriptPubKey, max_datacarrier_bytes, whichType)) {
            reason = "scriptpubkey";
            return false;
        }

        if (whichType == TxoutType::NULL_DATA)
            nDataOut++;
        else if ((whichType == TxoutType::MULTISIG) && (!permit_bare_multisig)) {
            reason = "bare-multisig";
            return false;
        } else if (IsDust(txout, dust_relay_fee)) {
            reason = "dust";
            return false;
        }
    }

    // only one OP_RETURN txout is permitted
    if (nDataOut > 1) {
        reason = "multi-op-return";
        return false;
    }

    return true;
}